

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

void xmlSchemaPCustomAttrErr
               (xmlSchemaParserCtxtPtr ctxt,xmlParserErrors error,xmlChar **ownerDes,
               xmlSchemaBasicItemPtr ownerItem,xmlAttrPtr attr,char *msg)

{
  xmlChar *unaff_RBX;
  xmlChar *unaff_R12;
  xmlChar *in_stack_ffffffffffffffc8;
  xmlChar *strData2;
  
  strData2 = (xmlChar *)0x0;
  xmlSchemaFormatItemForReport
            ((xmlChar **)&stack0xffffffffffffffd0,(xmlChar *)0x0,(xmlSchemaBasicItemPtr)ownerDes[5],
             (xmlNodePtr)ownerItem);
  xmlSchemaPErrExt(ctxt,(xmlNodePtr)ownerDes,error,(xmlChar *)"%s, attribute \'%s\': %s.\n",strData2
                   ,ownerDes[2],(char *)ownerItem,(xmlChar *)0x0,in_stack_ffffffffffffffc8,strData2,
                   unaff_RBX,unaff_R12);
  if (strData2 != (xmlChar *)0x0) {
    (*xmlFree)(strData2);
  }
  return;
}

Assistant:

static void
xmlSchemaPCustomAttrErr(xmlSchemaParserCtxtPtr ctxt,
			xmlParserErrors error,
			xmlChar **ownerDes,
			xmlSchemaBasicItemPtr ownerItem,
			xmlAttrPtr attr,
			const char *msg)
{
    xmlChar *des = NULL;

    if (ownerDes == NULL)
	xmlSchemaFormatItemForReport(&des, NULL, ownerItem, attr->parent);
    else if (*ownerDes == NULL) {
	xmlSchemaFormatItemForReport(ownerDes, NULL, ownerItem, attr->parent);
	des = *ownerDes;
    } else
	des = *ownerDes;
    if (attr == NULL) {
	xmlSchemaPErrExt(ctxt, NULL, error, NULL, NULL, NULL,
	    "%s, attribute '%s': %s.\n",
	    BAD_CAST des, (const xmlChar *) "Unknown",
	    (const xmlChar *) msg, NULL, NULL);
    } else {
	xmlSchemaPErrExt(ctxt, (xmlNodePtr) attr, error, NULL, NULL, NULL,
	    "%s, attribute '%s': %s.\n",
	    BAD_CAST des, attr->name, (const xmlChar *) msg, NULL, NULL);
    }
    if (ownerDes == NULL)
	FREE_AND_NULL(des);
}